

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

VarnodeTpl * __thiscall StartSymbol::getVarnode(StartSymbol *this)

{
  VarnodeTpl *this_00;
  ConstTpl sz_zero;
  ConstTpl off;
  ConstTpl spc;
  
  ConstTpl::ConstTpl(&spc,this->const_space);
  ConstTpl::ConstTpl(&off,j_start);
  sz_zero.type = real;
  sz_zero.value_real = 0;
  this_00 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_00,&spc,&off,&sz_zero);
  return this_00;
}

Assistant:

VarnodeTpl *StartSymbol::getVarnode(void) const

{ // Returns current instruction offset as a constant
  ConstTpl spc(const_space);
  ConstTpl off(ConstTpl::j_start);
  ConstTpl sz_zero;
  return new VarnodeTpl(spc,off,sz_zero);
}